

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetPropertyWithDescriptor<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<unsigned_short> **pdescriptor,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  PropertyAttributes PVar2;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  uint propertyId;
  bool bVar7;
  unsigned_short uVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  Var aValue;
  RecyclableObject *function;
  DynamicObject *pDVar11;
  Var pvVar12;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_60;
  int i;
  PropertyRecord *propertyRecord_local;
  Var local_48;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  uint local_34;
  
  _i = propertyRecord;
  propertyRecord_local._4_4_ = flags;
  local_40 = this;
  if ((pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> **)0x0) ||
     (*pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar7) goto LAB_00db306a;
    *puVar10 = 0;
  }
  pDVar3 = *pdescriptor;
  local_34 = _i->pid;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar7) goto LAB_00db306a;
    *puVar10 = 0;
  }
  if ((pDVar3->Attributes & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar7) goto LAB_00db306a;
    *puVar10 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar7) goto LAB_00db306a;
    *puVar10 = 0;
  }
  pRVar4 = (local_40->singletonInstance).ptr;
  if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pDVar11 = (DynamicObject *)0x0;
  }
  else {
    pDVar11 = (DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
  }
  local_48 = value;
  if (pDVar11 != instance && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ed,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar7) goto LAB_00db306a;
    *puVar10 = 0;
  }
  uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar3);
  pvVar12 = local_48;
  if (uVar8 == 0xffff) {
    uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar3);
    pvVar12 = local_48;
    if (uVar8 != 0xffff) {
      uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar3);
      aValue = DynamicObject::GetSlot(instance,(uint)uVar8);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pvVar12,(ScriptContext *)0x0);
      bVar7 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,(PropertyRecord **)&i,pdescriptor,
                         (int *)&local_60);
      if (bVar7) {
        pDVar3 = *pdescriptor;
        uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar3);
        if (uVar8 == 0xffff) {
          uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar3);
          if (uVar8 != 0xffff) {
            uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar3);
            if (info != (PropertyValueInfo *)0x0) {
              PVar2 = pDVar3->Attributes;
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = uVar8;
              info->m_attributes = PVar2;
              info->flags = InlineCacheSetterFlag;
            }
          }
        }
        else if (info != (PropertyValueInfo *)0x0) {
          PVar2 = pDVar3->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar8;
          info->m_attributes = PVar2;
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<unsigned_short> *)0x0;
      }
    }
  }
  else {
    if ((pDVar3->flags & IsInitialized) == None) {
      if ((((propertyRecord_local._4_4_ & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (pDVar3->flags = pDVar3->flags | IsInitialized, pDVar11 == instance)) &&
         ((propertyRecord_local._4_4_ &
          (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < local_34)) {
        if (local_48 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x305,"(value != nullptr)","value != nullptr");
          if (!bVar7) goto LAB_00db306a;
          *puVar10 = 0;
        }
        BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar9 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar7) {
LAB_00db306a:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar10 = 0;
        }
        bVar7 = VarIs<Js::JavascriptFunction>(pvVar12);
        if (bVar7) {
          bVar7 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar7 = !bVar7;
        }
        else {
          bVar7 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar7) {
            bVar7 = false;
          }
          else {
            bVar7 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,pvVar12);
          }
        }
        pDVar3->flags = bVar7 << 5 | pDVar3->flags & ~IsFixed;
      }
    }
    else {
      InvalidateFixedField<int>(local_40,instance,local_34,pDVar3);
    }
    pvVar12 = local_48;
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar8,local_48);
    if ((pDVar3->flags & (IsFixed|IsInitialized)) == IsInitialized) {
      if (info != (PropertyValueInfo *)0x0) {
        PVar2 = pDVar3->Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = uVar8;
        info->m_attributes = PVar2;
        info->flags = InlineCacheNoFlags;
      }
    }
    else if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  propertyId = local_34;
  bVar7 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_34);
  if ((bVar7) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    pJVar5 = (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary;
    Memory::Recycler::WBSetBit((char *)&local_60);
    pvVar12 = local_48;
    local_60 = &pJVar5->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pvVar12,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }